

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_slot.cpp
# Opt level: O0

void __thiscall CsSignal::SlotBase::~SlotBase(SlotBase *this)

{
  bool bVar1;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *this_00;
  SignalBase **ppSVar2;
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  *prVar3;
  ConnectStruct *pCVar4;
  const_iterator local_a0;
  node *local_98;
  end_iterator local_89;
  iterator local_88;
  iterator iter;
  write_handle senderListHandle;
  SignalBase **sender;
  const_iterator cStack_50;
  end_iterator __end1;
  const_iterator __begin1;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *__range1;
  undefined1 local_30 [8];
  read_handle receiverListHandle;
  SlotBase *this_local;
  
  this->_vptr_SlotBase = (_func_int **)&PTR__SlotBase_0012cd68;
  receiverListHandle._24_8_ = this;
  libguarded::
  rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
  ::lock_read((read_handle *)local_30,&this->m_possibleSenders);
  this_00 = libguarded::
            rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
            ::read_handle::operator*((read_handle *)local_30);
  cStack_50 = libguarded::
              rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
              ::begin(this_00);
  libguarded::
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  ::end(this_00);
  while (bVar1 = libguarded::
                 rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
                 ::const_iterator::operator!=
                           (&stack0xffffffffffffffb0,(end_iterator *)((long)&sender + 7)), bVar1) {
    ppSVar2 = libguarded::
              rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
              ::const_iterator::operator*(&stack0xffffffffffffffb0);
    libguarded::
    rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
    ::lock_write((write_handle *)&iter,&(*ppSVar2)->m_connectList);
    prVar3 = libguarded::
             rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
             ::write_handle::operator->((write_handle *)&iter);
    local_88 = libguarded::
               rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
               ::begin(prVar3);
    while( true ) {
      prVar3 = libguarded::
               rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
               ::write_handle::operator->((write_handle *)&iter);
      libguarded::
      rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
      ::end(prVar3);
      bVar1 = libguarded::
              rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
              ::iterator::operator!=(&local_88,&local_89);
      if (!bVar1) break;
      pCVar4 = libguarded::
               rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
               ::iterator::operator->(&local_88);
      if (pCVar4->receiver == this) {
        prVar3 = libguarded::
                 rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
                 ::write_handle::operator->((write_handle *)&iter);
        libguarded::
        rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
        ::const_iterator::const_iterator(&local_a0,&local_88);
        local_98 = (node *)libguarded::
                           rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
                           ::erase(prVar3,local_a0);
        local_88 = (iterator)local_98;
      }
      else {
        libguarded::
        rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
        ::iterator::operator++(&local_88);
      }
    }
    libguarded::
    rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
    ::write_handle::~write_handle((write_handle *)&iter);
    libguarded::
    rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
    ::const_iterator::operator++(&stack0xffffffffffffffb0);
  }
  libguarded::
  rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
  ::read_handle::~read_handle((read_handle *)local_30);
  libguarded::
  rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
  ::~rcu_guarded(&this->m_possibleSenders);
  return;
}

Assistant:

CsSignal::SlotBase::~SlotBase()
{
   try {
      // clean up possible sender connections
      auto receiverListHandle = m_possibleSenders.lock_read();

      for (auto &sender : *receiverListHandle) {
         auto senderListHandle = sender->m_connectList.lock_write();

         auto iter = senderListHandle->begin();

         while (iter != senderListHandle->end())   {

            if (iter->receiver == this) {
               iter = senderListHandle->erase(iter);
            } else {
               ++iter;
            }
         }
      }

   } catch (...) {
     // least of the worst options
     std::terminate();
   }
}